

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask.c
# Opt level: O3

void aom_lowbd_blend_a64_d16_mask_c
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  char cVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  
  cVar10 = (char)conv_params->round_1 + (char)conv_params->round_0;
  iVar3 = (-1 << (0x15U - cVar10 & 0x1f)) + (-1 << (0x16U - cVar10 & 0x1f));
  bVar2 = 0xe - cVar10;
  if (subh == 0 && subw == 0) {
    if (0 < h) {
      local_60 = 0;
      local_64 = 0;
      local_68 = 0;
      local_6c = 0;
      iVar7 = 0;
      do {
        if (0 < w) {
          uVar8 = (ulong)(uint)w;
          uVar13 = local_60;
          uVar11 = local_64;
          uVar1 = local_68;
          uVar4 = local_6c;
          do {
            iVar6 = ((int)((uint)src1[uVar1] * (0x40 - (uint)mask[uVar13]) +
                          (uint)src0[uVar11] * (uint)mask[uVar13]) >> 6) +
                    ((1 << (bVar2 & 0x1f)) >> 1) + iVar3;
            if (iVar6 >> (bVar2 & 0x1f) < 1) {
              iVar6 = 0;
            }
            iVar6 = iVar6 >> (bVar2 & 0x1f);
            if (0xfe < iVar6) {
              iVar6 = 0xff;
            }
            dst[uVar4] = (uint8_t)iVar6;
            uVar4 = uVar4 + 1;
            uVar1 = uVar1 + 1;
            uVar11 = uVar11 + 1;
            uVar13 = uVar13 + 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        iVar7 = iVar7 + 1;
        local_6c = local_6c + dst_stride;
        local_68 = local_68 + src1_stride;
        local_64 = local_64 + src0_stride;
        local_60 = local_60 + mask_stride;
      } while (iVar7 != h);
    }
  }
  else if (subh == 1 && (subw ^ 1U) == 0) {
    if (0 < h) {
      iVar7 = mask_stride * 2;
      iVar15 = 0;
      local_64 = 0;
      local_68 = 0;
      local_6c = 0;
      iVar6 = 0;
      do {
        if (0 < w) {
          lVar14 = 0;
          uVar13 = local_64;
          uVar11 = local_68;
          uVar1 = local_6c;
          do {
            iVar5 = (int)lVar14;
            uVar4 = (uint)mask[iVar5 + iVar15 + 1] +
                    (uint)mask[mask_stride + iVar5] + (uint)mask[(uint)(iVar5 + iVar15)] +
                    (uint)mask[mask_stride + iVar5 + 1] + 2 >> 2;
            iVar5 = ((int)((uint)src1[uVar11] * (0x40 - uVar4) + src0[uVar13] * uVar4) >> 6) +
                    ((1 << (bVar2 & 0x1f)) >> 1) + iVar3;
            if (iVar5 >> (bVar2 & 0x1f) < 1) {
              iVar5 = 0;
            }
            iVar5 = iVar5 >> (bVar2 & 0x1f);
            if (0xfe < iVar5) {
              iVar5 = 0xff;
            }
            dst[uVar1] = (uint8_t)iVar5;
            uVar1 = uVar1 + 1;
            uVar11 = uVar11 + 1;
            uVar13 = uVar13 + 1;
            lVar14 = lVar14 + 2;
          } while ((ulong)(uint)w * 2 != lVar14);
        }
        iVar6 = iVar6 + 1;
        local_6c = local_6c + dst_stride;
        local_68 = local_68 + src1_stride;
        local_64 = local_64 + src0_stride;
        iVar15 = iVar15 + iVar7;
        mask_stride = mask_stride + iVar7;
      } while (iVar6 != h);
    }
  }
  else if ((subw ^ 1U) == 0 && subh == 0) {
    if (0 < h) {
      local_64 = 0;
      local_68 = 0;
      local_6c = 0;
      uVar13 = 0;
      iVar7 = 0;
      do {
        if (0 < w) {
          uVar8 = (ulong)(uint)w;
          uVar11 = local_64;
          uVar1 = local_68;
          uVar4 = local_6c;
          uVar12 = uVar13;
          do {
            uVar9 = (uint)mask[uVar12] + (uint)mask[uVar12 + 1] + 1 >> 1 & 0xff;
            iVar6 = ((int)((uint)src1[uVar1] * (0x40 - uVar9) + src0[uVar11] * uVar9) >> 6) +
                    ((1 << (bVar2 & 0x1f)) >> 1) + iVar3;
            if (iVar6 >> (bVar2 & 0x1f) < 1) {
              iVar6 = 0;
            }
            iVar6 = iVar6 >> (bVar2 & 0x1f);
            if (0xfe < iVar6) {
              iVar6 = 0xff;
            }
            dst[uVar4] = (uint8_t)iVar6;
            uVar12 = uVar12 + 2;
            uVar4 = uVar4 + 1;
            uVar1 = uVar1 + 1;
            uVar11 = uVar11 + 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        iVar7 = iVar7 + 1;
        uVar13 = uVar13 + mask_stride;
        local_6c = local_6c + dst_stride;
        local_68 = local_68 + src1_stride;
        local_64 = local_64 + src0_stride;
      } while (iVar7 != h);
    }
  }
  else if (0 < h) {
    local_64 = 0;
    local_68 = 0;
    local_6c = 0;
    local_60 = 0;
    iVar7 = 0;
    do {
      if (0 < w) {
        uVar8 = (ulong)(uint)w;
        uVar13 = local_64;
        uVar11 = local_68;
        uVar1 = local_6c;
        uVar4 = local_60;
        do {
          uVar12 = (uint)mask[uVar13] + (uint)mask[mask_stride + uVar13] + 1 >> 1 & 0xff;
          iVar6 = ((int)((uint)src1[uVar1] * (0x40 - uVar12) + src0[uVar11] * uVar12) >> 6) +
                  ((1 << (bVar2 & 0x1f)) >> 1) + iVar3;
          if (iVar6 >> (bVar2 & 0x1f) < 1) {
            iVar6 = 0;
          }
          iVar6 = iVar6 >> (bVar2 & 0x1f);
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          dst[uVar4] = (uint8_t)iVar6;
          uVar4 = uVar4 + 1;
          uVar1 = uVar1 + 1;
          uVar11 = uVar11 + 1;
          uVar13 = uVar13 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      iVar7 = iVar7 + 1;
      local_60 = local_60 + dst_stride;
      local_6c = local_6c + src1_stride;
      local_68 = local_68 + src0_stride;
      local_64 = local_64 + mask_stride * 2;
    } while (iVar7 != h);
  }
  return;
}

Assistant:

void aom_lowbd_blend_a64_d16_mask_c(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params) {
  int i, j;
  const int bd = 8;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (subw == 0 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        int32_t res;
        const int m = mask[i * mask_stride + j];
        res = ((m * (int32_t)src0[i * src0_stride + j] +
                (AOM_BLEND_A64_MAX_ALPHA - m) *
                    (int32_t)src1[i * src1_stride + j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        dst[i * dst_stride + j] =
            clip_pixel(ROUND_POWER_OF_TWO(res, round_bits));
      }
    }
  } else if (subw == 1 && subh == 1) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        int32_t res;
        const int m = ROUND_POWER_OF_TWO(
            mask[(2 * i) * mask_stride + (2 * j)] +
                mask[(2 * i + 1) * mask_stride + (2 * j)] +
                mask[(2 * i) * mask_stride + (2 * j + 1)] +
                mask[(2 * i + 1) * mask_stride + (2 * j + 1)],
            2);
        res = ((m * (int32_t)src0[i * src0_stride + j] +
                (AOM_BLEND_A64_MAX_ALPHA - m) *
                    (int32_t)src1[i * src1_stride + j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        dst[i * dst_stride + j] =
            clip_pixel(ROUND_POWER_OF_TWO(res, round_bits));
      }
    }
  } else if (subw == 1 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        int32_t res;
        const int m = AOM_BLEND_AVG(mask[i * mask_stride + (2 * j)],
                                    mask[i * mask_stride + (2 * j + 1)]);
        res = ((m * (int32_t)src0[i * src0_stride + j] +
                (AOM_BLEND_A64_MAX_ALPHA - m) *
                    (int32_t)src1[i * src1_stride + j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        dst[i * dst_stride + j] =
            clip_pixel(ROUND_POWER_OF_TWO(res, round_bits));
      }
    }
  } else {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        int32_t res;
        const int m = AOM_BLEND_AVG(mask[(2 * i) * mask_stride + j],
                                    mask[(2 * i + 1) * mask_stride + j]);
        res = ((int32_t)(m * (int32_t)src0[i * src0_stride + j] +
                         (AOM_BLEND_A64_MAX_ALPHA - m) *
                             (int32_t)src1[i * src1_stride + j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        dst[i * dst_stride + j] =
            clip_pixel(ROUND_POWER_OF_TWO(res, round_bits));
      }
    }
  }
}